

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O0

void __thiscall Fl_Menu_::Fl_Menu_(Fl_Menu_ *this,int X,int Y,int W,int H,char *l)

{
  char *l_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Menu_ *this_local;
  
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,l);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Menu__002ecb58;
  Fl_Widget::set_flag(&this->super_Fl_Widget,0x40);
  Fl_Widget::box(&this->super_Fl_Widget,FL_UP_BOX);
  Fl_Widget::when(&this->super_Fl_Widget,'\x06');
  this->menu_ = (Fl_Menu_Item *)0x0;
  this->value_ = (Fl_Menu_Item *)0x0;
  this->alloc = '\0';
  Fl_Widget::selection_color(&this->super_Fl_Widget,0xf);
  textfont(this,0);
  textsize(this,FL_NORMAL_SIZE);
  textcolor(this,0);
  down_box(this,FL_NO_BOX);
  return;
}

Assistant:

Fl_Menu_::Fl_Menu_(int X,int Y,int W,int H,const char* l)
: Fl_Widget(X,Y,W,H,l) {
  set_flag(SHORTCUT_LABEL);
  box(FL_UP_BOX);
  when(FL_WHEN_RELEASE_ALWAYS);
  value_ = menu_ = 0;
  alloc = 0;
  selection_color(FL_SELECTION_COLOR);
  textfont(FL_HELVETICA);
  textsize(FL_NORMAL_SIZE);
  textcolor(FL_FOREGROUND_COLOR);
  down_box(FL_NO_BOX);
}